

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
::find_position<int>
          (dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
           *this,int *key)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  
  uVar3 = this->num_buckets - 1;
  uVar4 = uVar3 & (long)*key;
  iVar1 = (this->key_info).empty_key;
  iVar6 = this->table[uVar4].first;
  if (iVar1 == iVar6) {
    uVar7 = 0xffffffffffffffff;
  }
  else {
    uVar7 = 0xffffffffffffffff;
    lVar5 = 1;
    uVar2 = uVar4;
    do {
      if ((this->num_deleted == 0) || ((this->key_info).delkey != iVar6)) {
        if (*key == iVar6) {
          uVar4 = 0xffffffffffffffff;
          goto LAB_00a5dbeb;
        }
      }
      else if (uVar7 == 0xffffffffffffffff) {
        uVar7 = uVar2;
      }
      uVar4 = uVar2 + lVar5 & uVar3;
      iVar6 = this->table[uVar4].first;
      lVar5 = lVar5 + 1;
      uVar2 = uVar4;
    } while (iVar1 != iVar6);
  }
  uVar2 = 0xffffffffffffffff;
  if (uVar7 != 0xffffffffffffffff) {
    uVar4 = uVar7;
  }
LAB_00a5dbeb:
  pVar8.second = uVar4;
  pVar8.first = uVar2;
  return pVar8;
}

Assistant:

size_type bucket_count() const { return num_buckets; }